

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O3

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::insertAt
          (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this,size_t index,
          Expression *item)

{
  ulong uVar1;
  ulong uVar2;
  
  if (index <= this->usedElements) {
    resize(this,this->usedElements + 1);
    uVar2 = this->usedElements;
    while (uVar1 = uVar2 - 1, index < uVar1) {
      this->data[uVar1] = this->data[uVar2 - 2];
      uVar2 = uVar1;
    }
    this->data[index] = item;
    return;
  }
  __assert_fail("index <= size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                ,0x174,
                "void ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::insertAt(size_t, T) [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
               );
}

Assistant:

void insertAt(size_t index, T item) {
    assert(index <= size()); // appending is ok
    resize(size() + 1);
    for (auto i = size() - 1; i > index; --i) {
      data[i] = data[i - 1];
    }
    data[index] = item;
  }